

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O0

void __thiscall
mjs::with_statement::with_statement
          (with_statement *this,source_extend *extend,expression_ptr *e,statement_ptr *s)

{
  bool bVar1;
  statement_ptr *s_local;
  expression_ptr *e_local;
  source_extend *extend_local;
  with_statement *this_local;
  
  statement::syntax_node(&this->super_statement,extend);
  (this->super_statement).super_syntax_node._vptr_syntax_node =
       (_func_int **)&PTR__with_statement_00298818;
  std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>::unique_ptr(&this->e_,e);
  std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>::unique_ptr(&this->s_,s);
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->e_);
  if (!bVar1) {
    __assert_fail("e_",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/parser.h",
                  0x317,
                  "mjs::with_statement::with_statement(const source_extend &, expression_ptr &&, statement_ptr &&)"
                 );
  }
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->s_);
  if (!bVar1) {
    __assert_fail("s_",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/parser.h",
                  0x318,
                  "mjs::with_statement::with_statement(const source_extend &, expression_ptr &&, statement_ptr &&)"
                 );
  }
  return;
}

Assistant:

explicit with_statement(const source_extend& extend, expression_ptr&& e, statement_ptr&& s) : statement(extend), e_(std::move(e)), s_(std::move(s)) {
        assert(e_);
        assert(s_);
    }